

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_main.c
# Opt level: O2

void glob_initfromgui(void *dummy,t_symbol *s,int argc,t_atom *argv)

{
  char *pcVar1;
  char *name;
  bool bVar2;
  int iVar3;
  t_symbol *ptVar4;
  long lVar5;
  t_symbol *dir;
  _binbuf *x;
  size_t size;
  long lVar6;
  _instancestuff *p_Var7;
  t_namelist **pptVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  t_float tVar13;
  t_float tVar14;
  char *nameptr;
  char dirbuf [1000];
  
  ptVar4 = atom_getsymbolarg(0,argc,argv);
  pcVar1 = ptVar4->s_name;
  tVar13 = atom_getfloatarg(1,argc,argv);
  sys_oldtclversion = (int)tVar13;
  if (argc != 0x26) {
    bug("glob_initfromgui");
  }
  lVar6 = 0x1e0138;
  iVar3 = 0;
  lVar5 = 0;
  bVar2 = false;
  while (lVar5 != 2) {
    lVar5 = lVar5 + 1;
    for (lVar10 = -0x12; lVar10 != 0; lVar10 = lVar10 + 3) {
      iVar11 = (int)lVar10;
      tVar13 = atom_getfloatarg(iVar11 + iVar3 + 0x14,argc,argv);
      iVar12 = (int)tVar13;
      tVar13 = atom_getfloatarg(iVar11 + iVar3 + 0x15,argc,argv);
      tVar14 = atom_getfloatarg(iVar11 + iVar3 + 0x16,argc,argv);
      if (((iVar12 == 0) || (iVar11 = (int)tVar13, iVar11 == 0)) ||
         (iVar9 = (int)tVar14, iVar9 == 0)) {
        iVar9 = (int)lVar5;
        iVar12 = *(int *)(&UNK_001ac368 + lVar10 * 4) * iVar9;
        iVar11 = *(int *)(&UNK_001ac36c + lVar10 * 4) * iVar9;
        iVar9 = defaultfontshit[lVar10] * iVar9;
        if (!bVar2) {
          logpost((void *)0x0,4,"ignoring invalid font-metrics from GUI");
        }
        bVar2 = true;
      }
      *(int *)(lVar6 + 0x40 + lVar10 * 4) = iVar12;
      *(int *)(lVar6 + 0x44 + lVar10 * 4) = iVar11;
      *(int *)(lVar6 + 0x48 + lVar10 * 4) = iVar9;
    }
    iVar3 = iVar3 + 0x12;
    lVar6 = lVar6 + 0x48;
  }
  iVar3 = sys_oktoloadfiles(0);
  p_Var7 = pd_maininstance.pd_stuff;
  if (iVar3 != 0) {
    while (p_Var7 = (_instancestuff *)p_Var7->st_externlist, p_Var7 != (_instancestuff *)0x0) {
      iVar3 = sys_load_lib((_glist *)0x0,(char *)p_Var7->st_searchpath);
      if (iVar3 == 0) {
        post("%s: can\'t load library",p_Var7->st_searchpath);
      }
    }
    sys_oktoloadfiles(1);
  }
  pptVar8 = &sys_openlist;
  while (pptVar8 = &((t_namelist *)pptVar8)->nl_next->nl_next,
        (t_namelist *)pptVar8 != (t_namelist *)0x0) {
    name = ((t_namelist *)pptVar8)->nl_string;
    iVar3 = open_via_path(pcVar1,name,"",dirbuf,&nameptr,1000,0);
    if (iVar3 < 0) {
      pd_error((void *)0x0,"%s: can\'t open",name);
    }
    else {
      close(iVar3);
      ptVar4 = gensym(nameptr);
      dir = gensym(dirbuf);
      glob_evalfile((t_pd *)0x0,ptVar4,dir);
    }
  }
  namelist_free(sys_openlist);
  sys_openlist = (t_namelist *)0x0;
  pptVar8 = &sys_messagelist;
  while (pptVar8 = &((t_namelist *)pptVar8)->nl_next->nl_next,
        (t_namelist *)pptVar8 != (t_namelist *)0x0) {
    x = binbuf_new();
    pcVar1 = ((t_namelist *)pptVar8)->nl_string;
    size = strlen(pcVar1);
    binbuf_text(x,pcVar1,size);
    binbuf_eval(x,(t_pd *)0x0,0,(t_atom *)0x0);
    binbuf_free(x);
  }
  namelist_free(sys_messagelist);
  sys_messagelist = (t_namelist *)0x0;
  return;
}

Assistant:

void glob_initfromgui(void *dummy, t_symbol *s, int argc, t_atom *argv)
{
    const char *cwd = atom_getsymbolarg(0, argc, argv)->s_name;
    t_namelist *nl;
    unsigned int i;
    int did_fontwarning = 0;
    int j;
    sys_oldtclversion = atom_getfloatarg(1, argc, argv);
    if (argc != 2 + 3 * NZOOM * NFONT)
        bug("glob_initfromgui");
    for (j = 0; j < NZOOM; j++)
        for (i = 0; i < NFONT; i++)
    {
        int size   = atom_getfloatarg(3 * (i + j * NFONT) + 2, argc, argv);
        int width  = atom_getfloatarg(3 * (i + j * NFONT) + 3, argc, argv);
        int height = atom_getfloatarg(3 * (i + j * NFONT) + 4, argc, argv);
        if (!(size && width && height))
        {
            size   = (j+1)*sys_fontspec[i].fi_pointsize;
            width  = (j+1)*sys_fontspec[i].fi_width;
            height = (j+1)*sys_fontspec[i].fi_height;
            if (!did_fontwarning)
            {
                logpost(NULL, PD_VERBOSE, "ignoring invalid font-metrics from GUI");
                did_fontwarning = 1;
            }
        }
        sys_gotfonts[j][i].fi_pointsize = size;
        sys_gotfonts[j][i].fi_width = width;
        sys_gotfonts[j][i].fi_height = height;
#if 0
            fprintf(stderr, "font (%d %d %d)\n",
                sys_gotfonts[j][i].fi_pointsize, sys_gotfonts[j][i].fi_width,
                    sys_gotfonts[j][i].fi_height);
#endif
    }
        /* load dynamic libraries specified with "-lib" args */
    if (sys_oktoloadfiles(0))
    {
        for  (nl = STUFF->st_externlist; nl; nl = nl->nl_next)
            if (!sys_load_lib(0, nl->nl_string))
                post("%s: can't load library", nl->nl_string);
        sys_oktoloadfiles(1);
    }
        /* open patches specifies with "-open" args */
    for  (nl = sys_openlist; nl; nl = nl->nl_next)
        openit(cwd, nl->nl_string);
    namelist_free(sys_openlist);
    sys_openlist = 0;
        /* send messages specified with "-send" args */
    for  (nl = sys_messagelist; nl; nl = nl->nl_next)
    {
        t_binbuf *b = binbuf_new();
        binbuf_text(b, nl->nl_string, strlen(nl->nl_string));
        binbuf_eval(b, 0, 0, 0);
        binbuf_free(b);
    }
    namelist_free(sys_messagelist);
    sys_messagelist = 0;
}